

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O2

bool Diligent::PipelineResourcesCompatible(PipelineResourceDesc *lhs,PipelineResourceDesc *rhs)

{
  int iVar1;
  
  iVar1 = memcmp(&lhs->ShaderStages,&rhs->ShaderStages,0xb);
  return iVar1 == 0;
}

Assistant:

inline bool PipelineResourcesCompatible(const PipelineResourceDesc& lhs, const PipelineResourceDesc& rhs)
{
    // Ignore resource names.
    // clang-format off
    return lhs.ShaderStages == rhs.ShaderStages &&
           lhs.ArraySize    == rhs.ArraySize    &&
           lhs.ResourceType == rhs.ResourceType &&
           lhs.VarType      == rhs.VarType      &&
           lhs.Flags        == rhs.Flags;
    // clang-format on
}